

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

CEPlanet * CEPlanet::Saturn(void)

{
  CEPlanet *in_RDI;
  CEPlanet *saturn;
  CEPlanet *angle;
  CEPlanet *this;
  uint in_stack_ffffffffffffff80;
  CEAngle *ycoord;
  CEAngle *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  CEPlanet *this_00;
  undefined1 local_31 [40];
  undefined1 local_9;
  
  local_9 = CIRS;
  this = (CEPlanet *)local_31;
  angle = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"Saturn",(allocator *)this);
  this_00 = (CEPlanet *)0x0;
  CEAngle::CEAngle((CEAngle *)this,(double *)angle);
  ycoord = (CEAngle *)0x0;
  CEAngle::CEAngle((CEAngle *)this,(double *)angle);
  CEPlanet(this_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,ycoord,
           (CESkyCoordType *)(ulong)in_stack_ffffffffffffff80);
  CEAngle::~CEAngle((CEAngle *)0x13c481);
  CEAngle::~CEAngle((CEAngle *)0x13c48b);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  SetSemiMajorAxis_AU(this,(double)angle,(double)in_RDI);
  SetEccentricity(in_RDI,0.05550825,-0.00032044);
  SetInclination(in_RDI,2.49424102,0.00451969,DEGREES);
  SetMeanLongitude(in_RDI,50.07571329,1222.11494724,DEGREES);
  SetPerihelionLongitude(in_RDI,92.86136063,0.54179478,DEGREES);
  SetAscendingNodeLongitude(in_RDI,113.63998702,-0.25015002,DEGREES);
  SetExtraTerms(in_RDI,0.00025899,-0.13434469,0.87320147,38.35125);
  SetMeanRadius_m(in_RDI,58232000.0);
  SetAlbedo(in_RDI,0.47);
  SetMass_kg(in_RDI,5.68319e+26);
  SetSofaID(this,(double *)angle);
  return angle;
}

Assistant:

CEPlanet CEPlanet::Saturn()
{
    CEPlanet saturn("Saturn", 0.0, 0.0) ;
    saturn.SetSemiMajorAxis_AU(9.54149883, -0.00003065) ;
    saturn.SetEccentricity(0.05550825, -0.00032044) ;
    saturn.SetInclination(2.49424102, 0.00451969, CEAngleType::DEGREES) ;
    saturn.SetMeanLongitude(50.07571329, 1222.11494724, CEAngleType::DEGREES) ;
    saturn.SetPerihelionLongitude(92.86136063, 0.54179478, CEAngleType::DEGREES) ;
    saturn.SetAscendingNodeLongitude(113.63998702, -0.25015002, CEAngleType::DEGREES) ;
    
    saturn.SetExtraTerms(0.00025899, -0.13434469, 0.87320147, 38.35125000) ;
    
    // Set planetary properties
    saturn.SetMeanRadius_m(58232000.0) ;
    saturn.SetAlbedo(0.47) ;
    saturn.SetMass_kg(5.68319E26) ;
    
    // Set the sofa planet ID
    saturn.SetSofaID(6) ;
    
    return saturn ;
}